

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O0

void __thiscall TimerTest_simultaneousTimers_Test::TestBody(TimerTest_simultaneousTimers_Test *this)

{
  __pthread_internal_list **this_00;
  bool bVar1;
  char *pcVar2;
  undefined1 local_130 [8];
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> lock_1;
  Message local_108 [12];
  int local_fc;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar;
  duration<long,_std::ratio<1L,_1000000000L>_> local_e0 [3];
  anon_class_32_4_28dd8a92 local_c8;
  function<void_(jessilib::timer_&)> local_a8;
  undefined8 local_88;
  undefined1 local_80 [8];
  timer timer_obj;
  undefined1 local_68 [3];
  bool test_finished;
  int timers_running;
  mutex notifier_mutex;
  condition_variable notifier;
  TimerTest_simultaneousTimers_Test *this_local;
  
  this_00 = &notifier_mutex.super___mutex_base._M_mutex.__data.__list.__next;
  std::condition_variable::condition_variable((condition_variable *)this_00);
  std::mutex::mutex((mutex *)local_68);
  timer_obj.m_context.super___shared_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = 0;
  timer_obj.m_context.super___shared_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._3_1_ = 0;
  local_88 = 1000000;
  local_c8.timers_running =
       (int *)((long)&timer_obj.m_context.
                      super___shared_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 4);
  local_c8.test_finished =
       (bool *)((long)&timer_obj.m_context.
                       super___shared_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 3);
  local_c8.notifier = (condition_variable *)this_00;
  local_c8.notifier_mutex = (mutex *)local_68;
  std::function<void(jessilib::timer&)>::
  function<TimerTest_simultaneousTimers_Test::TestBody()::__0,void>
            ((function<void(jessilib::timer&)> *)&local_a8,&local_c8);
  jessilib::timer::timer((timer *)local_80,local_88,&local_a8);
  std::function<void_(jessilib::timer_&)>::~function(&local_a8);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )ms<(char)49,(char)48,(char)48>();
  local_e0[0].__r =
       (rep)std::chrono::operator+
                      (&period,(duration<long,_std::ratio<1L,_1000L>_> *)&gtest_ar.message_);
  std::this_thread::sleep_for<long,std::ratio<1l,1000000000l>>(local_e0);
  local_fc = 2;
  testing::internal::CmpHelperGE<int,int>
            ((internal *)local_f8,"timers_running","2",
             (int *)((long)&timer_obj.m_context.
                            super___shared_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi + 4),&local_fc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(local_108);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&lock_1._M_owns,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/timer.cpp"
               ,0xad,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&lock_1._M_owns,local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&lock_1._M_owns);
    testing::Message::~Message(local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&lock._M_owns,(mutex_type *)local_68);
  timer_obj.m_context.super___shared_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._3_1_ = 1;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&lock._M_owns);
  std::condition_variable::notify_all();
  jessilib::timer::cancel();
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_130,(mutex_type *)local_68);
  std::condition_variable::wait<TimerTest_simultaneousTimers_Test::TestBody()::__1>
            ((condition_variable *)&notifier_mutex.super___mutex_base._M_mutex.__data.__list.__next,
             (unique_lock<std::mutex> *)local_130,
             (int *)((long)&timer_obj.m_context.
                            super___shared_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi + 4));
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_130);
  jessilib::timer::~timer((timer *)local_80);
  std::condition_variable::~condition_variable
            ((condition_variable *)&notifier_mutex.super___mutex_base._M_mutex.__data.__list.__next)
  ;
  return;
}

Assistant:

TEST(TimerTest, simultaneousTimers) {
	std::condition_variable notifier;
	std::mutex notifier_mutex;
	int timers_running = 0;
	bool test_finished = false;

	// Spin up timer
	timer timer_obj{period, [&notifier, &notifier_mutex, &timers_running, &test_finished]([[maybe_unused]] timer& in_timer) {
		std::unique_lock<std::mutex> lock(notifier_mutex);
		if (test_finished) {
			notifier.notify_all();
			return;
		}

		++timers_running;

		// Wait for a few more timer periods to pass before proceeding
		notifier.wait(lock);

		// We're done here; cancel
		--timers_running;
		notifier.notify_all();
	}};

	// Wait for some timers to fire
	std::this_thread::sleep_for(period + 100ms);
	EXPECT_GE(timers_running, 2);

	// Notify timers to close
	{
		std::unique_lock<std::mutex> lock(notifier_mutex);
		test_finished = true;
	}
	notifier.notify_all();

	// Wait for timers to complete
	timer_obj.cancel();
	std::unique_lock<std::mutex> lock(notifier_mutex);
	notifier.wait(lock, [&timers_running]() {
		return timers_running == 0;
	});
}